

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  double dVar6;
  
  pFVar1 = (this->left_->fadexpr_).right_;
  pFVar2 = (this->right_->fadexpr_).left_;
  pFVar3 = (this->right_->fadexpr_).right_;
  pFVar4 = (pFVar2->fadexpr_).right_;
  dVar6 = (double)(pFVar3->fadexpr_).left_.constant_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  return (pFVar5->val_ * dVar6 + (double)(pFVar2->fadexpr_).left_.constant_ + pFVar4->val_) *
         (pFVar1->dx_).ptr_to_data[i] +
         ((double)(this->left_->fadexpr_).left_.constant_ + pFVar1->val_) *
         (dVar6 * (pFVar5->dx_).ptr_to_data[i] + (pFVar4->dx_).ptr_to_data[i]);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}